

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDEdge::MarkedFaceCount(ON_SubDEdge *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_short efi;
  ushort uVar4;
  ON_SubDFacePtr *pOVar5;
  
  pOVar5 = this->m_face2;
  uVar4 = 0;
  uVar2 = 0;
  while ((uVar4 < this->m_face_count &&
         ((uVar4 != 2 || (pOVar5 = this->m_facex, pOVar5 != (ON_SubDFacePtr *)0x0))))) {
    uVar3 = pOVar5->m_ptr & 0xfffffffffffffff8;
    if (uVar3 != 0) {
      bVar1 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(uVar3 + 0x10));
      uVar2 = uVar2 + bVar1;
    }
    uVar4 = uVar4 + 1;
    pOVar5 = pOVar5 + 1;
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdge::MarkedFaceCount() const
{
  unsigned int mark_count = 0;
  const ON_SubDFacePtr* fptr = m_face2;
  for (unsigned short efi = 0; efi < m_face_count; ++efi, ++fptr)
  {
    if (2 == efi)
    {
      fptr = m_facex;
      if (nullptr == fptr)
        break;
    }
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr->m_ptr);
    if (nullptr != f && f->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}